

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainUtils.c
# Opt level: O2

void Abc_UtilsPrintUsage(Abc_Frame_t *pAbc,char *ProgName)

{
  fputc(10,(FILE *)pAbc->Err);
  fprintf((FILE *)pAbc->Err,
          "usage: %s [-c cmd] [-q cmd] [-C cmd] [-Q cmd] [-f script] [-h] [-o file] [-s] [-t type] [-T type] [-x] [-b] [file]\n"
          ,ProgName);
  fwrite("    -c cmd\texecute commands `cmd\'\n",0x22,1,(FILE *)pAbc->Err);
  fwrite("    -q cmd\texecute commands `cmd\' quietly\n",0x2a,1,(FILE *)pAbc->Err);
  fwrite("    -C cmd\texecute commands `cmd\', then continue in interactive mode\n",0x45,1,
         (FILE *)pAbc->Err);
  fwrite("    -Q cmd\texecute commands `cmd\' quietly, then continue in interactive mode\n",0x4d,1,
         (FILE *)pAbc->Err);
  fwrite("    -F script\texecute commands from a script file and echo commands\n",0x44,1,
         (FILE *)pAbc->Err);
  fwrite("    -f script\texecute commands from a script file\n",0x32,1,(FILE *)pAbc->Err);
  fwrite("    -h\t\tprint the command usage\n",0x20,1,(FILE *)pAbc->Err);
  fwrite("    -o file\tspecify output filename to store the result\n",0x38,1,(FILE *)pAbc->Err);
  fwrite("    -s\t\tdo not read any initialization file\n",0x2c,1,(FILE *)pAbc->Err);
  fwrite("    -t type\tspecify input type (blif_mv (default), blif_mvs, blif, or none)\n",0x4c,1,
         (FILE *)pAbc->Err);
  fwrite("    -T type\tspecify output type (blif_mv (default), blif_mvs, blif, or none)\n",0x4d,1,
         (FILE *)pAbc->Err);
  fwrite("    -x\t\tequivalent to \'-t none -T none\'\n",0x28,1,(FILE *)pAbc->Err);
  fwrite("    -b\t\trunning in bridge mode\n",0x1f,1,(FILE *)pAbc->Err);
  fputc(10,(FILE *)pAbc->Err);
  return;
}

Assistant:

void Abc_UtilsPrintUsage( Abc_Frame_t * pAbc, char * ProgName )
{
    fprintf( pAbc->Err, "\n" );
    fprintf( pAbc->Err,
             "usage: %s [-c cmd] [-q cmd] [-C cmd] [-Q cmd] [-f script] [-h] [-o file] [-s] [-t type] [-T type] [-x] [-b] [file]\n",
             ProgName);
    fprintf( pAbc->Err, "    -c cmd\texecute commands `cmd'\n");
    fprintf( pAbc->Err, "    -q cmd\texecute commands `cmd' quietly\n");
    fprintf( pAbc->Err, "    -C cmd\texecute commands `cmd', then continue in interactive mode\n");
    fprintf( pAbc->Err, "    -Q cmd\texecute commands `cmd' quietly, then continue in interactive mode\n");
    fprintf( pAbc->Err, "    -F script\texecute commands from a script file and echo commands\n");
    fprintf( pAbc->Err, "    -f script\texecute commands from a script file\n");
    fprintf( pAbc->Err, "    -h\t\tprint the command usage\n");
    fprintf( pAbc->Err, "    -o file\tspecify output filename to store the result\n");
    fprintf( pAbc->Err, "    -s\t\tdo not read any initialization file\n");
    fprintf( pAbc->Err, "    -t type\tspecify input type (blif_mv (default), blif_mvs, blif, or none)\n");
    fprintf( pAbc->Err, "    -T type\tspecify output type (blif_mv (default), blif_mvs, blif, or none)\n");
    fprintf( pAbc->Err, "    -x\t\tequivalent to '-t none -T none'\n");
    fprintf( pAbc->Err, "    -b\t\trunning in bridge mode\n");
    fprintf( pAbc->Err, "\n" );
}